

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

ssize_t __thiscall
trial::protocol::buffer::vector<unsigned_char,_std::allocator<unsigned_char>_>::write
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *this,int __fd,void *__buf,
          size_t __n)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  uint uVar1;
  size_type sVar2;
  undefined4 extraout_var;
  const_iterator __first;
  const_iterator __last;
  iterator iVar3;
  undefined4 in_register_00000034;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator local_20;
  basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
  *local_18;
  view_type *view_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_local;
  
  local_18 = (basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
              *)CONCAT44(in_register_00000034,__fd);
  view_local = (view_type *)this;
  sVar2 = std::
          basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
          ::size(local_18);
  uVar1 = (*(this->super_base<unsigned_char>)._vptr_base[2])(this,sVar2);
  iVar3._M_current = (uchar *)CONCAT44(extraout_var,uVar1);
  if ((uVar1 & 1) != 0) {
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)this->buffer;
    local_28._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this->buffer);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_20,&local_28);
    __first = std::
              basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
              ::begin(local_18);
    __last = std::
             basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
             ::end(local_18);
    iVar3 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<unsigned_char_const*,void>(this_00,local_20,__first,__last);
  }
  return (ssize_t)iVar3._M_current;
}

Assistant:

virtual void write(const view_type& view)
    {
        if (grow(view.size()))
        {
            buffer.insert(buffer.end(), view.begin(), view.end());
        }
    }